

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O3

void __thiscall
chaiscript::detail::Dispatch_Engine::dump_function
          (Dispatch_Engine *this,
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>
          *f)

{
  ostream *poVar1;
  Type_Info *type;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> params;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_38;
  
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (&local_38,
             &((f->second).
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->m_types);
  dump_type(this,local_38.
                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(f->first)._M_dataplus._M_p,(f->first)._M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
  type = local_38.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
         _M_impl.super__Vector_impl_data._M_start + 1;
  if (type != local_38.
              super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
    do {
      dump_type(this,type);
      type = type + 1;
      if (type == local_38.
                  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                  _M_impl.super__Vector_impl_data._M_finish) break;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    } while (type != local_38.
                     super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,") \n",3);
  if (local_38.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
      _M_impl.super__Vector_impl_data._M_start != (Type_Info *)0x0) {
    operator_delete(local_38.
                    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void dump_function(const std::pair<const std::string, Proxy_Function> &f) const {
        const auto params = f.second->get_param_types();

        dump_type(params.front());
        std::cout << " " << f.first << "(";

        for (auto itr = params.begin() + 1; itr != params.end();) {
          dump_type(*itr);
          ++itr;

          if (itr != params.end()) {
            std::cout << ", ";
          }
        }

        std::cout << ") \n";
      }